

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O0

void charls::transform_line<charls::transform_hp1<unsigned_short>,unsigned_short>
               (quad<unsigned_short> *destination,quad<unsigned_short> *source,size_t pixel_count,
               transform_hp1<unsigned_short> *transform,uint32_t mask)

{
  triplet<unsigned_short> triplet_value;
  quad<unsigned_short> local_40;
  transform_hp1<unsigned_short> *local_38;
  size_t i;
  transform_hp1<unsigned_short> *ptStack_28;
  uint32_t mask_local;
  transform_hp1<unsigned_short> *transform_local;
  size_t pixel_count_local;
  quad<unsigned_short> *source_local;
  quad<unsigned_short> *destination_local;
  
  i._4_4_ = mask;
  ptStack_28 = transform;
  transform_local = (transform_hp1<unsigned_short> *)pixel_count;
  pixel_count_local = (size_t)source;
  source_local = destination;
  for (local_38 = (transform_hp1<unsigned_short> *)0x0; local_38 < transform_local;
      local_38 = local_38 + 1) {
    triplet_value =
         transform_hp1<unsigned_short>::operator()
                   (ptStack_28,*(ushort *)(pixel_count_local + (long)local_38 * 8) & i._4_4_,
                    *(ushort *)(pixel_count_local + 2 + (long)local_38 * 8) & i._4_4_,
                    *(ushort *)(pixel_count_local + 4 + (long)local_38 * 8) & i._4_4_);
    quad<unsigned_short>::quad
              (&local_40,triplet_value,
               *(ushort *)(pixel_count_local + 6 + (long)local_38 * 8) & i._4_4_);
    source_local[(long)local_38] = local_40;
  }
  return;
}

Assistant:

void transform_line(quad<PixelType>* destination, const quad<PixelType>* source, const size_t pixel_count,
                    Transform& transform, const uint32_t mask) noexcept
{
    for (size_t i{}; i < pixel_count; ++i)
    {
        destination[i] =
            quad<PixelType>(transform(source[i].v1 & mask, source[i].v2 & mask, source[i].v3 & mask), source[i].v4 & mask);
    }
}